

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O3

void __thiscall
CT::MemContourTracing
          (CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,int x,int y,int i_label,
          bool b_external)

{
  int *piVar1;
  undefined4 extraout_EDX;
  int iVar2;
  undefined1 auVar3 [16];
  bool b_isolated;
  int i_previous_contour_point;
  Point2i s;
  undefined1 local_58 [20];
  uint local_44;
  int local_40;
  int local_3c;
  int local_38;
  int iStack_34;
  
  piVar1 = (int *)(**(long **)&(img_labels->accesses_).field_0x48 * (long)y +
                   *(long *)&(img_labels->accesses_).field_0x10 + (long)x * 4);
  *piVar1 = *piVar1 + 1;
  *(int *)((long)y * **(long **)&(img_labels->img_).field_0x48 +
           *(long *)&(img_labels->img_).field_0x10 + (long)x * 4) = i_label;
  local_44 = b_external ^ 7;
  local_58._16_4_ = i_label;
  local_38 = x;
  iStack_34 = y;
  MemTracer((CT *)local_58,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,(Point2i *)img_labels,
            &stack0xffffffffffffffc8,(bool *)&local_44);
  local_58._12_4_ = local_58._4_4_;
  local_58._8_4_ = local_58._0_4_;
  do {
    do {
      piVar1 = (int *)(**(long **)&(img_labels->accesses_).field_0x48 * (long)(int)local_58._4_4_ +
                       *(long *)&(img_labels->accesses_).field_0x10 + (long)(int)local_58._0_4_ * 4)
      ;
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)
       ((long)(int)local_58._4_4_ * **(long **)&(img_labels->img_).field_0x48 +
        *(long *)&(img_labels->img_).field_0x10 + (long)(int)local_58._0_4_ * 4) = local_58._16_4_;
      MemTracer((CT *)&stack0xffffffffffffffc0,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,
                (Point2i *)img_labels,(int *)local_58,(bool *)&local_44);
      auVar3._4_4_ = -(uint)(local_38 == local_58._0_4_);
      auVar3._0_4_ = -(uint)(local_38 == local_58._0_4_);
      auVar3._8_4_ = -(uint)(iStack_34 == local_58._4_4_);
      auVar3._12_4_ = -(uint)(iStack_34 == local_58._4_4_);
      iVar2 = movmskpd(extraout_EDX,auVar3);
      local_58._0_4_ = local_40;
      local_58._4_4_ = local_3c;
    } while (iVar2 != 3);
  } while (local_3c != local_58._12_4_ || local_40 != local_58._8_4_);
  return;
}

Assistant:

void MemContourTracing(MemMat<unsigned char> &img, MemMat<int> &img_labels, int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
        img_labels(s.y, s.x) = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = MemTracer(img, img_labels, s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_labels(crd_cur_point.y, crd_cur_point.x) = i_label;
            crd_next_point = MemTracer(img, img_labels, crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }